

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLIViewController.cpp
# Opt level: O2

bool __thiscall CLIViewController::parseControl(CLIViewController *this,char key)

{
  byte bVar1;
  bool bVar2;
  Vector2 **ppVVar3;
  SW2048Game *this_00;
  
  if (((this->KEYBOARD_ARROW_UP_WIN == key) || (bVar1 = key & 0xdf, bVar1 == 0x57)) ||
     (this->KEYBOARD_ARROW_UP_MAC == key)) {
    this_00 = this->game;
    ppVVar3 = &Vector2::DOWN;
  }
  else if (((this->KEYBOARD_ARROW_DOWN_WIN == key) || (bVar1 == 0x53)) ||
          (this->KEYBOARD_ARROW_DOWN_MAC == key)) {
    this_00 = this->game;
    ppVVar3 = &Vector2::UP;
  }
  else if (((this->KEYBOARD_ARROW_LEFT_WIN == key) || (bVar1 == 0x41)) ||
          (this->KEYBOARD_ARROW_LEFT_MAC == key)) {
    bVar2 = SW2048Game::isPlaying(this->game);
    this_00 = this->game;
    if (!bVar2) {
      SW2048Game::restart(this_00);
      return true;
    }
    ppVVar3 = &Vector2::LEFT;
  }
  else {
    if (((this->KEYBOARD_ARROW_RIGHT_WIN != key) && (bVar1 != 0x44)) &&
       (this->KEYBOARD_ARROW_RIGHT_MAC != key)) {
      return false;
    }
    bVar2 = SW2048Game::isPlaying(this->game);
    if (!bVar2) {
      exit(0);
    }
    this_00 = this->game;
    ppVVar3 = &Vector2::RIGHT;
  }
  SW2048Game::move(this_00,*ppVVar3);
  return true;
}

Assistant:

bool CLIViewController::parseControl(char key)
{
	if (key == CLIViewController::KEYBOARD_ARROW_UP_WIN
	 || key == CLIViewController::KEYBOARD_ARROW_UP_MAC
	 || key == 'w' || key == 'W')
		game->move(Vector2::DOWN);
	else if (key == CLIViewController::KEYBOARD_ARROW_DOWN_WIN
		  || key == CLIViewController::KEYBOARD_ARROW_DOWN_MAC
		  || key == 's' || key == 'S')
		game->move(Vector2::UP);
	else if (key == CLIViewController::KEYBOARD_ARROW_LEFT_WIN
		  || key == CLIViewController::KEYBOARD_ARROW_LEFT_MAC
		  || key == 'a' || key == 'A')
		if (game->isPlaying())
			game->move(Vector2::LEFT);
		else
			game->restart();
	else if (key == CLIViewController::KEYBOARD_ARROW_RIGHT_WIN
		  || key == CLIViewController::KEYBOARD_ARROW_RIGHT_MAC
		  || key == 'd' || key == 'D')
		if (game->isPlaying())
			game->move(Vector2::RIGHT);
		else
			std::exit(EXIT_SUCCESS);
	else
		return false;
	return true;
}